

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O2

value * __thiscall
mjs::interpreter::impl::operator()(value *__return_storage_ptr__,impl *this,function_expression *e)

{
  create_function((impl *)&stack0xffffffffffffffe0,(function_base *)this,
                  (scope_ptr *)&e->super_function_base);
  value::value(__return_storage_ptr__,(object_ptr *)&stack0xffffffffffffffe0);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&stack0xffffffffffffffe0);
  return __return_storage_ptr__;
}

Assistant:

value operator()(const function_expression& e) {
        // string{heap_, s.id()}
        return value{create_function(e, active_scope_)};
    }